

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_promise_resolve_function_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_val,int argc,JSValue *argv,int flags
                  )

{
  JSValue value;
  JSValue promise;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue op2;
  JSValue op1;
  JSValue value_00;
  JSValue promise_00;
  JSValue JVar1;
  int iVar2;
  BOOL BVar3;
  int64_t in_RCX;
  long in_RSI;
  JSValueUnion in_RDI;
  int in_R9D;
  JSValue JVar4;
  long *in_stack_00000008;
  JSValue error;
  undefined1 in_stack_00000028 [16];
  undefined1 in_stack_00000038 [16];
  BOOL is_reject;
  JSValue then;
  JSValue args [3];
  JSValue resolution;
  JSPromiseFunctionData *s;
  JSObject *p;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  JSContext *in_stack_fffffffffffffed0;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_fffffffffffffed8;
  JSValueUnion JVar5;
  int64_t in_stack_fffffffffffffee0;
  JSValueUnion JVar6;
  JSContext *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int argc_00;
  JSJobFunc *in_stack_ffffffffffffff00;
  JSContext *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  long local_90;
  undefined4 local_88;
  BOOL is_reject_00;
  JSContext *ctx_01;
  undefined4 in_stack_ffffffffffffff90;
  uint uStack_3c;
  JSValueUnion local_10;
  
  ctx_01 = *(JSContext **)(in_RSI + 0x30);
  if ((ctx_01 == (JSContext *)0x0) || (*(int *)((long)&((ctx_01->header).link.next)->prev + 4) != 0)
     ) goto LAB_0014c5b6;
  *(undefined4 *)((long)&((ctx_01->header).link.next)->prev + 4) = 1;
  if (in_R9D < 1) {
    in_stack_ffffffffffffff10 = 0;
    local_90 = (ulong)in_stack_ffffffffffffff14 << 0x20;
    local_88 = 3;
    is_reject_00 = 0;
  }
  else {
    local_90 = *in_stack_00000008;
    local_88 = (undefined4)in_stack_00000008[1];
    is_reject_00 = (BOOL)((ulong)in_stack_00000008[1] >> 0x20);
  }
  if ((*(short *)(in_RSI + 6) == 0x2b) &&
     (JVar4.tag._0_4_ = local_88, JVar4.u = (JSValueUnion)local_90, JVar4.tag._4_4_ = is_reject_00,
     iVar2 = JS_IsObject(JVar4), iVar2 != 0)) {
    op1.tag._0_4_ = in_stack_ffffffffffffff10;
    op1.u.ptr = in_stack_ffffffffffffff08;
    op1.tag._4_4_ = in_stack_ffffffffffffff14;
    op2.u._4_4_ = in_stack_fffffffffffffefc;
    op2.u.int32 = in_stack_fffffffffffffef8;
    op2.tag = (int64_t)in_stack_ffffffffffffff00;
    BVar3 = js_same_value(in_stack_fffffffffffffef0,op1,op2);
    if (BVar3 == 0) {
      in_stack_fffffffffffffec8 = 0;
      JVar4 = JS_GetPropertyInternal
                        ((JSContext *)error.tag,(JSValue)in_stack_00000038,error.u._4_4_,
                         (JSValue)in_stack_00000028,(BOOL)p);
      local_10 = JVar4.u;
      argc_00 = JVar4.tag._4_4_;
      iVar2 = JS_IsException(JVar4);
      if (iVar2 == 0) {
        iVar2 = JS_IsFunction((JSContext *)in_RDI.ptr,JVar4);
        if (iVar2 != 0) {
          JS_EnqueueJob(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,argc_00,
                        (JSValue *)local_10.ptr);
          v_01.tag = in_stack_fffffffffffffee0;
          v_01.u.ptr = in_stack_fffffffffffffed8.ptr;
          JS_FreeValue(in_stack_fffffffffffffed0,v_01);
          goto LAB_0014c5b6;
        }
        v_00.tag = in_stack_fffffffffffffee0;
        v_00.u.ptr = in_stack_fffffffffffffed8.ptr;
        JS_FreeValue(in_stack_fffffffffffffed0,v_00);
        goto LAB_0014c4df;
      }
    }
    else {
      JS_ThrowTypeError((JSContext *)in_RDI.ptr,"promise self resolution");
    }
    JVar4 = JS_GetException((JSContext *)in_RDI.ptr);
    ctx_00 = JVar4.u;
    JVar5 = (JSValueUnion)JVar4.tag;
    promise.tag = (int64_t)ctx_00.ptr;
    promise.u.ptr = JVar5.ptr;
    value.u._4_4_ = in_stack_fffffffffffffecc;
    value.u.int32 = in_stack_fffffffffffffec8;
    value.tag = (int64_t)ctx_00.ptr;
    JVar6 = ctx_00;
    reject_promise((JSContext *)0x14c490,promise,value);
    v.tag = (int64_t)JVar6.ptr;
    v.u.ptr = JVar5.ptr;
    JS_FreeValue((JSContext *)ctx_00.ptr,v);
  }
  else {
LAB_0014c4df:
    promise_00.tag = in_RCX;
    promise_00.u.ptr = in_RDI.ptr;
    value_00.tag._0_4_ = in_stack_ffffffffffffff90;
    value_00.u = (JSValueUnion)in_RSI;
    value_00.tag._4_4_ = in_R9D;
    fulfill_or_reject_promise(ctx_01,promise_00,value_00,is_reject_00);
  }
LAB_0014c5b6:
  JVar1.tag = 3;
  JVar1.u.ptr = (void *)((ulong)uStack_3c << 0x20);
  return JVar1;
}

Assistant:

static JSValue js_promise_resolve_function_call(JSContext *ctx,
                                                JSValueConst func_obj,
                                                JSValueConst this_val,
                                                int argc, JSValueConst *argv,
                                                int flags)
{
    JSObject *p = JS_VALUE_GET_OBJ(func_obj);
    JSPromiseFunctionData *s;
    JSValueConst resolution, args[3];
    JSValue then;
    BOOL is_reject;

    s = p->u.promise_function_data;
    if (!s || s->presolved->already_resolved)
        return JS_UNDEFINED;
    s->presolved->already_resolved = TRUE;
    is_reject = p->class_id - JS_CLASS_PROMISE_RESOLVE_FUNCTION;
    if (argc > 0)
        resolution = argv[0];
    else
        resolution = JS_UNDEFINED;
#ifdef DUMP_PROMISE
    printf("js_promise_resolving_function_call: is_reject=%d resolution=", is_reject);
    JS_DumpValue(ctx, resolution);
    printf("\n");
#endif
    if (is_reject || !JS_IsObject(resolution)) {
        goto done;
    } else if (js_same_value(ctx, resolution, s->promise)) {
        JS_ThrowTypeError(ctx, "promise self resolution");
        goto fail_reject;
    }
    then = JS_GetProperty(ctx, resolution, JS_ATOM_then);
    if (JS_IsException(then)) {
        JSValue error;
    fail_reject:
        error = JS_GetException(ctx);
        reject_promise(ctx, s->promise, error);
        JS_FreeValue(ctx, error);
    } else if (!JS_IsFunction(ctx, then)) {
        JS_FreeValue(ctx, then);
    done:
        fulfill_or_reject_promise(ctx, s->promise, resolution, is_reject);
    } else {
        args[0] = s->promise;
        args[1] = resolution;
        args[2] = then;
        JS_EnqueueJob(ctx, js_promise_resolve_thenable_job, 3, args);
        JS_FreeValue(ctx, then);
    }
    return JS_UNDEFINED;
}